

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.c
# Opt level: O0

void mi_stat_update(mi_stat_count_t *stat,int64_t amount)

{
  _Bool _Var1;
  int64_t iVar2;
  long in_RSI;
  int64_t *in_RDI;
  int64_t current;
  
  if (in_RSI != 0) {
    _Var1 = mi_is_in_main(in_RDI);
    if (_Var1) {
      iVar2 = mi_atomic_addi64_relaxed(in_RDI + 2,in_RSI);
      mi_atomic_maxi64_relaxed(in_RDI + 1,iVar2 + in_RSI);
      if (0 < in_RSI) {
        mi_atomic_addi64_relaxed(in_RDI,in_RSI);
      }
    }
    else {
      in_RDI[2] = in_RSI + in_RDI[2];
      if (in_RDI[1] < in_RDI[2]) {
        in_RDI[1] = in_RDI[2];
      }
      if (0 < in_RSI) {
        *in_RDI = in_RSI + *in_RDI;
      }
    }
  }
  return;
}

Assistant:

static void mi_stat_update(mi_stat_count_t* stat, int64_t amount) {
  if (amount == 0) return;
  if mi_unlikely(mi_is_in_main(stat))
  {
    // add atomically (for abandoned pages)
    int64_t current = mi_atomic_addi64_relaxed(&stat->current, amount);
    // if (stat == &_mi_stats_main.committed) { mi_assert_internal(current + amount >= 0); };
    mi_atomic_maxi64_relaxed(&stat->peak, current + amount);
    if (amount > 0) {
      mi_atomic_addi64_relaxed(&stat->total,amount);
    }
  }
  else {
    // add thread local
    stat->current += amount;
    if (stat->current > stat->peak) { stat->peak = stat->current; }
    if (amount > 0) { stat->total += amount; }
  }
}